

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ProgressEndEvent>::destruct
          (BasicTypeInfo<dap::ProgressEndEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ProgressEndEvent> *this_local;
  
  ProgressEndEvent::~ProgressEndEvent((ProgressEndEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }